

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECatAccess.cpp
# Opt level: O2

long __thiscall bhf::ads::ECatAccess::ListECatMasters(ECatAccess *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  string *this_00;
  uint uVar3;
  uint32_t bytesRead;
  uint16_t devType;
  uint32_t numberOfDevices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> deviceIds;
  string local_2e8;
  AmsNetId netId;
  stringstream stream;
  ostream local_2b0 [376];
  char deviceName [255];
  
  lVar1 = AdsDevice::ReadReqEx2(&this->device,0x5000,2,4,&numberOfDevices,&bytesRead);
  if (lVar1 == 0) {
    if (numberOfDevices == 0) {
      lVar1 = 0;
    }
    else {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&deviceIds,(ulong)(numberOfDevices + 1),(allocator_type *)&stream);
      lVar1 = AdsDevice::ReadReqEx2
                        (&this->device,0x5000,1,
                         (long)deviceIds.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)deviceIds.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         deviceIds.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start,&bytesRead);
      if (lVar1 == 0) {
        for (uVar3 = 1; uVar3 <= numberOfDevices; uVar3 = uVar3 + 1) {
          lVar1 = AdsDevice::ReadReqEx2
                            (&this->device,
                             deviceIds.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3] + 0x5000,7,2,&devType,
                             &bytesRead);
          if (lVar1 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&stream);
            poVar2 = std::operator<<(local_2b0,"Reading type for device[");
            poVar2 = (ostream *)
                     std::ostream::operator<<
                               (poVar2,deviceIds.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar3]);
            poVar2 = std::operator<<(poVar2,"] failed with 0x");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::_M_insert<long>((long)poVar2);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,(string *)deviceName);
            goto LAB_001248aa;
          }
          memset(deviceName,0,0xff);
          lVar1 = AdsDevice::ReadReqEx2
                            (&this->device,
                             deviceIds.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3] + 0x5000,1,0xfe,
                             deviceName,&bytesRead);
          if (lVar1 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&stream);
            poVar2 = std::operator<<(local_2b0,"Reading name for device[");
            poVar2 = (ostream *)
                     std::ostream::operator<<
                               (poVar2,deviceIds.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar3]);
            poVar2 = std::operator<<(poVar2,"] failed with 0x");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::_M_insert<long>((long)poVar2);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,&local_2e8);
LAB_00124baa:
            this_00 = &local_2e8;
            goto LAB_00124baf;
          }
          AmsNetId::AmsNetId(&netId,0);
          lVar1 = AdsDevice::ReadReqEx2
                            (&this->device,
                             deviceIds.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3] + 0x5000,5,6,&netId,
                             &bytesRead);
          if (lVar1 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&stream);
            poVar2 = std::operator<<(local_2b0,"Reading AmsNetId for device[");
            poVar2 = (ostream *)
                     std::ostream::operator<<
                               (poVar2,deviceIds.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar3]);
            poVar2 = std::operator<<(poVar2,"] failed with 0x");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::_M_insert<long>((long)poVar2);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,&local_2e8);
            goto LAB_00124baa;
          }
          CountECatSlaves(this,&netId);
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (os,deviceIds.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar3]);
          poVar2 = std::operator<<(poVar2," | ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,devType);
          poVar2 = std::operator<<(poVar2," | ");
          poVar2 = std::operator<<(poVar2,deviceName);
          poVar2 = std::operator<<(poVar2," | ");
          poVar2 = ::operator<<(poVar2,&netId);
          poVar2 = std::operator<<(poVar2," | ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<(poVar2,'\n');
        }
        lVar1 = 0;
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar2 = std::operator<<(local_2b0,"Reading device ids failed with 0x");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<long>((long)poVar2);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,(string *)deviceName);
LAB_001248aa:
        this_00 = (string *)deviceName;
LAB_00124baf:
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&deviceIds.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar2 = std::operator<<(local_2b0,"Reading device count failed with 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long>((long)poVar2);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)deviceName);
    std::__cxx11::string::~string((string *)deviceName);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return lVar1;
}

Assistant:

long ECatAccess::ListECatMasters(std::ostream& os) const
{
    uint32_t numberOfDevices;
    uint32_t bytesRead;

    auto status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVCOUNT,
        sizeof(numberOfDevices), &numberOfDevices,
        &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device count failed with 0x" << std::hex << status);
        return status;
    }

    if (numberOfDevices == 0) {
        return status;
    }

    // the first element of the vector is set to devCount,
    // so the actual device Ids start at index 1
    std::vector<uint16_t> deviceIds(numberOfDevices + 1);

    status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVIDS,
        deviceIds.capacity() * sizeof(uint16_t),
        deviceIds.data(), &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device ids failed with 0x" << std::hex << status);
        return status;
    }

    // Skip the device count, which is at the first index
    for (uint32_t i = 1; i <= numberOfDevices; i++) {
        uint16_t devType;
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVTYPE,
            sizeof(devType),
            &devType,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading type for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        char deviceName[0xff] = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNAME,
            sizeof(deviceName) - 1,
            deviceName,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading name for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        AmsNetId netId = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNETID,
            sizeof(netId),
            &netId,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading AmsNetId for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        const auto slaveCount = CountECatSlaves(netId);
        os << deviceIds[i] << " | " << devType << " | " << deviceName << " | " << netId << " | " << slaveCount << '\n';
    }
    return status;
}